

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream * QtPrivate::readArrayBasedContainer<QList<TCBPoint>>(QDataStream *s,QList<TCBPoint> *c)

{
  Status SVar1;
  qint64 asize;
  long in_FS_OFFSET;
  bool bVar2;
  TCBPoint local_78;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_48,s);
  QList<TCBPoint>::clear(c);
  asize = QDataStream::readQSizeType(s);
  if (asize < 0) {
    QDataStream::setStatus(s,SizeLimitExceeded);
  }
  else {
    QList<TCBPoint>::reserve(c,asize);
    while (bVar2 = asize != 0, asize = asize + -1, bVar2) {
      local_78._t._0_4_ = 0xffffffff;
      local_78._t._4_4_ = 0xffffffff;
      local_78._c._0_4_ = 0xffffffff;
      local_78._c._4_4_ = 0xffffffff;
      local_78._b = -NAN;
      local_78._point.xp = 0.0;
      local_78._point.yp = 0.0;
      ::operator>>(s,&local_78);
      SVar1 = QDataStream::status(s);
      if (SVar1 != Ok) {
        QList<TCBPoint>::clear(c);
        break;
      }
      QList<TCBPoint>::emplaceBack<TCBPoint_const&>(c,&local_78);
    }
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}